

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O2

string * pstore::logger::to_string<long_long>
                   (string *__return_storage_ptr__,czstring message,longlong t)

{
  string sStack_38;
  
  std::__cxx11::to_string(&sStack_38,t);
  std::operator+(__return_storage_ptr__,message,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string (gsl::czstring const message, T const t) {
                return message + std::to_string (t);
            }